

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSwitch.c
# Opt level: O2

void Gia_ManSwiDelete(Gia_ManSwi_t *p)

{
  Gia_ManStop(p->pAig);
  if (p->pData1 != (int *)0x0) {
    free(p->pData1);
    p->pData1 = (int *)0x0;
  }
  if (p->pDataSim != (uint *)0x0) {
    free(p->pDataSim);
    p->pDataSim = (uint *)0x0;
  }
  if (p->pDataSimCis != (uint *)0x0) {
    free(p->pDataSimCis);
    p->pDataSimCis = (uint *)0x0;
  }
  free(p->pDataSimCos);
  free(p);
  return;
}

Assistant:

void Gia_ManSwiDelete( Gia_ManSwi_t * p )
{
    Gia_ManStop( p->pAig );
    ABC_FREE( p->pData1 );
    ABC_FREE( p->pDataSim );
    ABC_FREE( p->pDataSimCis );
    ABC_FREE( p->pDataSimCos );
    ABC_FREE( p );
}